

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O0

uint8 * rw::ps2::rasterLock(Raster *raster,int32 level,int32 lockMode)

{
  int iVar1;
  int32 psm;
  bool bVar2;
  int local_38;
  int local_34;
  int32 miph;
  int32 mipw;
  int32 minh;
  int32 minw;
  Ps2Raster *natras;
  int32 lockMode_local;
  int32 level_local;
  Raster *raster_local;
  
  _minh = (long)&raster->platform + (long)nativeRasterOffset;
  natras._0_4_ = lockMode;
  natras._4_4_ = level;
  _lockMode_local = raster;
  if (0 < level) {
    psm = 0x13;
    if ((raster->format & 0x4000U) != 0) {
      psm = 0x14;
    }
    natras._4_4_ = level;
    transferMinSize(psm,(int)*(char *)(_minh + 0x2c),&mipw,&miph);
    while (iVar1 = natras._4_4_ + -1, bVar2 = natras._4_4_ != 0, natras._4_4_ = iVar1, bVar2) {
      if (mipw < _lockMode_local->width) {
        local_34 = _lockMode_local->width;
      }
      else {
        local_34 = mipw;
      }
      if (miph < _lockMode_local->height) {
        local_38 = _lockMode_local->height;
      }
      else {
        local_38 = miph;
      }
      _lockMode_local->pixels =
           _lockMode_local->pixels +
           (int)(((local_34 * local_38 * _lockMode_local->depth) / 8 + 0xfU & 0xfffffff0) + 0x50);
      _lockMode_local->width = _lockMode_local->width / 2;
      _lockMode_local->height = _lockMode_local->height / 2;
    }
  }
  if (((uint)natras & 4) == 0) {
    unswizzleRaster(_lockMode_local);
  }
  if (((uint)natras & 2) != 0) {
    _lockMode_local->privateFlags = _lockMode_local->privateFlags | 2;
  }
  if (((uint)natras & 1) != 0) {
    _lockMode_local->privateFlags = _lockMode_local->privateFlags | 4;
  }
  return _lockMode_local->pixels;
}

Assistant:

uint8*
rasterLock(Raster *raster, int32 level, int32 lockMode)
{
	Ps2Raster *natras = GETPS2RASTEREXT(raster);
	assert(raster->depth != 24);

	if(level > 0){
		int32 minw, minh;
		int32 mipw, miph;
		transferMinSize(raster->format & Raster::PAL4 ? PSMT4 : PSMT8, natras->flags, &minw, &minh);
		while(level--){
			mipw = max(raster->width, minw);
			miph = max(raster->height, minh);
			raster->pixels += ALIGN16(mipw*miph*raster->depth/8) + 0x50;
			raster->width /= 2;
			raster->height /= 2;
		}
	}

	if((lockMode & Raster::LOCKNOFETCH) == 0)
		unswizzleRaster(raster);
	if(lockMode & Raster::LOCKREAD) raster->privateFlags |= Raster::PRIVATELOCK_READ;
	if(lockMode & Raster::LOCKWRITE) raster->privateFlags |= Raster::PRIVATELOCK_WRITE;
	return raster->pixels;
}